

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::modifyIntensityAperture_abi_cxx11_(Station *this,int aperture,double size)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *this_00;
  value_type *__x;
  int in_EDX;
  long in_RSI;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  pair<int,_double> pVar6;
  int j;
  int beamlet;
  int i_1;
  int i;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff;
  double *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int iVar7;
  value_type_conflict1 *in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  pair<int,_int> in_stack_ffffffffffffff48;
  key_type *in_stack_ffffffffffffff68;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *this_01;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_ffffffffffffff88;
  Station *in_stack_ffffffffffffff90;
  int local_50;
  int local_40;
  int local_2c;
  double local_20;
  
  this_01 = in_RDI;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x138e3e);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
  if ((*pvVar3 + in_XMM0_Qa < 0.0) ||
     (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX),
     local_20 = in_XMM0_Qa, (double)*(int *)(in_RSI + 0x44) < *pvVar3 + in_XMM0_Qa)) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
    if (0.0 <= *pvVar3 + in_XMM0_Qa) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
      if (*pvVar3 + in_XMM0_Qa <= (double)*(int *)(in_RSI + 0x44)) {
        return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)in_RDI;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
      if ((double)*(int *)(in_RSI + 0x44) <= *pvVar3) {
        return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)in_RDI;
      }
      in_stack_ffffffffffffff68 = (key_type *)(double)*(int *)(in_RSI + 0x44);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
      local_20 = (double)in_stack_ffffffffffffff68 - *pvVar3;
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
      if (*pvVar3 <= 0.0) {
        return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)in_RDI;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
      local_20 = *pvVar3;
    }
  }
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x139031);
  for (local_2c = 0; local_2c < *(int *)(in_RSI + 0x40); local_2c = local_2c + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)local_2c);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
  dVar1 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
  *pvVar3 = dVar1 + local_20;
  local_40 = 0;
  while (iVar7 = local_40, iVar2 = Collimator::getXdim(*(Collimator **)(in_RSI + 0xb0)),
        iVar7 < iVar2) {
    pvVar4 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           *)(in_RSI + 0x58),(long)in_EDX);
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pvVar4,(long)local_40);
    if (-1 < pvVar5->first) {
      pvVar4 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_EDX);
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar4,(long)local_40);
      if (-1 < pvVar5->second) {
        this_00 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  (in_RSI + 0xe0);
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_EDX);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (pvVar4,(long)local_40);
        in_stack_ffffffffffffff48 =
             std::make_pair<int&,int&>((int *)in_stack_ffffffffffffff28,(int *)0x1391dd);
        __x = (value_type *)
              std::
              map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
              ::operator[](this_01,in_stack_ffffffffffffff68);
        pvVar4 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_EDX);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar4,(long)local_40);
        local_50 = pvVar5->first;
        while( true ) {
          iVar7 = local_50;
          pvVar4 = std::
                   vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                 *)(in_RSI + 0x58),(long)in_EDX);
          pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](pvVar4,(long)local_40);
          if (pvVar5->second < iVar7) break;
          pVar6 = std::make_pair<int&,double&>
                            ((int *)CONCAT44(iVar7,in_stack_ffffffffffffff30),
                             in_stack_ffffffffffffff28);
          in_stack_ffffffffffffff28 = (double *)pVar6.second;
          in_stack_ffffffffffffff30 = pVar6.first;
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          push_back(this_00,__x);
          local_50 = local_50 + 1;
        }
      }
    }
    local_40 = local_40 + 1;
  }
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_01,
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             in_stack_ffffffffffffff68);
  updateIntensity(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x139336);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             CONCAT44(iVar2,iVar7),
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             in_stack_ffffffffffffff48);
  return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)in_RDI;
}

Assistant:

list <pair< int,double> > Station::modifyIntensityAperture(int aperture, double size) {
    list < pair <int, double > > diff;
    if ((intensity[aperture]+size) < 0 || (intensity[aperture]+size) > max_intensity) {
      if (intensity[aperture]+size < 0) {
        // Too low intensity
        if (intensity[aperture]>0)
          size = intensity[aperture];
        else
          return(diff);
      } else if ((intensity[aperture]+size) > max_intensity) {
        // Too high intensity
        if (intensity[aperture] < max_intensity)
          size = max_intensity - intensity[aperture];
        else 
          return(diff);
      } else {
        return (diff);
      }
    }
    
    // Save previous intensity
    last_intensity.clear();
    for (int i=0;i<max_apertures;i++) 
      last_intensity.push_back(intensity[i]);
    
    intensity[aperture] = intensity[aperture] + size;

    for (int i=0; i<collimator.getXdim(); i++) {
      if (A[aperture][i].first<0 || A[aperture][i].second<0) 
        continue;
      int beamlet = pos2beam[make_pair(i, A[aperture][i].first)];
      for(int j=A[aperture][i].first; j<=A[aperture][i].second; j++){
        diff.push_back(make_pair(beamlet, size));
        beamlet++;
      }
    }
    updateIntensity(diff);
    last_diff = diff;
    return (diff);
  }